

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::_update_saliency(Group *this,GroupState *state,View *view)

{
  SyncMode SVar1;
  uint64_t ijt;
  Code *object;
  float fVar2;
  double dVar3;
  P<r_exec::View> local_68;
  _Base_ptr local_60;
  P<r_exec::View> local_48;
  undefined1 local_39;
  double dStack_38;
  bool wiew_is_salient;
  double view_new_sln;
  double dStack_28;
  bool wiew_was_salient;
  double view_old_sln;
  View *view_local;
  GroupState *state_local;
  Group *this_local;
  
  view_old_sln = (double)view;
  view_local = (View *)state;
  state_local = (GroupState *)this;
  fVar2 = View::get_sln(view);
  dStack_28 = (double)fVar2;
  view_new_sln._7_1_ =
       (double)(view_local->super_View).super__Object._vptr__Object <= dStack_28 &&
       dStack_28 != (double)(view_local->super_View).super__Object._vptr__Object;
  dVar3 = update_sln(this,(View *)view_old_sln);
  dStack_38 = dVar3;
  fVar2 = get_sln_thr(this);
  local_39 = (double)fVar2 < dVar3;
  if (((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x1000000)
      == 0) {
    return;
  }
  if (!(bool)local_39) goto LAB_00239d01;
  SVar1 = View::get_sync((View *)view_old_sln);
  dVar3 = view_old_sln;
  if (SYNC_PERIODIC < SVar1) {
    if (SVar1 - SYNC_HOLD < 2) {
      ijt = (*Now)();
      r_code::View::set_ijt((View *)dVar3,ijt);
      core::P<r_exec::View>::P(&local_68,(View *)view_old_sln);
      std::
      multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>::
      insert(&this->newly_salient_views,&local_68);
      core::P<r_exec::View>::~P(&local_68);
      goto LAB_00239d01;
    }
    if (SVar1 != SYNC_ONCE_AXIOM) goto LAB_00239d01;
  }
  if ((view_new_sln._7_1_ & 1) == 0) {
    core::P<r_exec::View>::P(&local_48,(View *)view_old_sln);
    local_60 = (_Base_ptr)
               std::
               multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
               ::insert(&this->newly_salient_views,&local_48);
    core::P<r_exec::View>::~P(&local_48);
  }
LAB_00239d01:
  if (((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x100) != 0)
  {
    object = core::P::operator_cast_to_Code_((P *)((long)view_old_sln + 0x20));
    dVar3 = dStack_38 - dStack_28;
    fVar2 = get_sln_thr(this);
    _initiate_sln_propagation(this,object,dVar3,(double)fVar2);
  }
  return;
}

Assistant:

void Group::_update_saliency(GroupState *state, View *view)
{
    double view_old_sln = view->get_sln();
    bool wiew_was_salient = view_old_sln > state->former_sln_thr;
    double view_new_sln = update_sln(view);
    bool wiew_is_salient = view_new_sln > get_sln_thr();

    if (state->is_c_salient) {
        if (wiew_is_salient) {
            switch (view->get_sync()) {
            case View::SYNC_ONCE:
            case View::SYNC_ONCE_AXIOM:
            case View::SYNC_PERIODIC:
                if (!wiew_was_salient) { // sync on front: crosses the threshold upward: record as a newly salient view.
                    newly_salient_views.insert(view);
                }

                break;

            case View::SYNC_HOLD:
            case View::SYNC_AXIOM: // sync on state: treat as if it was a new injection.
                view->set_ijt(Now());
                newly_salient_views.insert(view);
                break;
            }
        }

        // inject sln propagation jobs.
        // the idea is to propagate sln changes when a view "occurs to the mind", i.e. becomes more salient in a group and is eligible for reduction in that group.
        // - when a view is now salient because the group becomes c-salient, no propagation;
        // - when a view is now salient because the group's sln_thr gets lower, no propagation;
        // - propagation can occur only if the group is c_active. For efficiency reasons, no propagation occurs even if some of the group's viewing groups are c-active and c-salient.
        if (state->is_c_active) {
            _initiate_sln_propagation(view->object, view_new_sln - view_old_sln, get_sln_thr());
        }
    }
}